

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

char * embree::trimEnd(char *token)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  
  if (*token != '\0') {
    pbVar2 = (byte *)(token + -1);
    bVar3 = 1;
    while (bVar3 != 0) {
      pbVar1 = pbVar2 + 2;
      pbVar2 = pbVar2 + 1;
      bVar3 = *pbVar1;
    }
    for (; (((ulong)*pbVar2 < 0x21 && ((0x100002200U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0)) &&
           (token <= pbVar2)); pbVar2 = pbVar2 + -1) {
      *pbVar2 = 0;
    }
  }
  return token;
}

Assistant:

static inline const char* trimEnd(const char* token) 
  {
    if (*token == 0) return token;
    char* pe = (char*) token;
    while (*pe) pe++;
    pe--;
    while ((*pe == ' ' || *pe == '\t' || *pe == '\r') && pe >= token) *pe-- = 0;
    return token;
  }